

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# results_reporter.hpp
# Opt level: O0

void __thiscall boost::unit_test::results_reporter::format::format(format *this)

{
  format *this_local;
  
  this->_vptr_format = (_func_int **)&PTR__format_003028d0;
  return;
}

Assistant:

class BOOST_TEST_DECL format {
public:
    // Destructor
    virtual ~format() {}

    virtual void    results_report_start( std::ostream& ostr ) = 0;
    virtual void    results_report_finish( std::ostream& ostr ) = 0;

    virtual void    test_unit_report_start( test_unit const&, std::ostream& ostr ) = 0;
    virtual void    test_unit_report_finish( test_unit const&, std::ostream& ostr ) = 0;

    virtual void    do_confirmation_report( test_unit const&, std::ostream& ostr ) = 0;
}